

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_maybe.cpp
# Opt level: O3

void __thiscall Maybe_AssignValue_Test::~Maybe_AssignValue_Test(Maybe_AssignValue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (Maybe, AssignValue) {
    maybe<value> m;

    // First assignment, m has no value
    m.operator=(value{43});
    EXPECT_TRUE (m.has_value ());
    EXPECT_TRUE (m);
    EXPECT_EQ (m.value (), value{43});

    // Second assignment, m holds a value
    m.operator=(value{44});
    EXPECT_TRUE (m.has_value ());
    EXPECT_TRUE (m);
    EXPECT_EQ (m.value (), value{44});

    // Third assignment, m holds a value, assigning nothing.
    m.operator= (pstore::nothing<value> ());
    EXPECT_FALSE (m.has_value ());
}